

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_step(sqlite3_stmt *pStmt)

{
  sqlite3_stmt *pz;
  int *piVar1;
  char cVar2;
  sqlite3 *db;
  undefined8 *puVar3;
  sqlite3 *psVar4;
  Btree *p_00;
  Wal *pWVar5;
  bool bVar6;
  Vdbe *pVVar7;
  Vdbe *pVVar8;
  Vdbe *pVVar9;
  long *plVar10;
  Vdbe *pFromStmt;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long *plVar15;
  undefined8 *puVar16;
  char *pcVar17;
  undefined4 uVar18;
  ulong uVar19;
  undefined8 uVar20;
  char *z2;
  long *plVar21;
  char *pcVar22;
  long lVar23;
  int iVar24;
  Mem *pMem;
  long lVar25;
  long lVar26;
  char *pcVar27;
  long lVar28;
  u32 uVar29;
  int iVar30;
  byte *pbVar31;
  int iVar32;
  long lVar33;
  Mem *p_01;
  Vdbe *p;
  Mem *local_1a0;
  Vdbe *local_170;
  Mem *local_168;
  sqlite3_stmt *local_160;
  long local_158 [37];
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    pcVar17 = "API called with NULL prepared statement";
  }
  else {
    db = *(sqlite3 **)pStmt;
    if (db != (sqlite3 *)0x0) {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      pStmt[0x8d] = (sqlite3_stmt)((byte)pStmt[0x8d] & 0xfd);
      local_160 = pStmt + 0xb8;
      pz = pStmt + 0x48;
      iVar30 = 0;
      do {
        if (*(int *)(pStmt + 0x44) != -0x420df25d) {
          sqlite3_reset(pStmt);
        }
        puVar3 = *(undefined8 **)pStmt;
        if (*(char *)((long)puVar3 + 0x51) != '\0') {
          uVar13 = 7;
          goto LAB_00113283;
        }
        uVar11 = *(ushort *)(pStmt + 0x8c);
        if (*(int *)(pStmt + 0x80) < 1) {
          if ((uVar11 & 8) == 0) {
            if (*(int *)(pStmt + 0x80) < 0) {
              iVar24 = *(int *)((long)puVar3 + 0xa4);
              if (iVar24 == 0) {
                *(undefined4 *)(puVar3 + 0x29) = 0;
              }
              if ((puVar3[0x1b] != 0) && (*(char *)((long)puVar3 + 0xa1) == '\0')) {
                sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar3,(sqlite3_int64 *)local_160);
                iVar24 = *(int *)((long)puVar3 + 0xa4);
              }
              *(int *)((long)puVar3 + 0xa4) = iVar24 + 1;
              uVar11 = *(ushort *)(pStmt + 0x8c);
              if ((uVar11 & 0x40) == 0) {
                *(int *)((long)puVar3 + 0xac) = *(int *)((long)puVar3 + 0xac) + 1;
                uVar11 = *(ushort *)(pStmt + 0x8c);
              }
              if ((char)uVar11 < '\0') {
                *(int *)(puVar3 + 0x15) = *(int *)(puVar3 + 0x15) + 1;
                uVar11 = *(ushort *)(pStmt + 0x8c);
              }
              *(undefined4 *)(pStmt + 0x80) = 0;
            }
            goto LAB_001126d0;
          }
          uVar13 = 1;
          uVar18 = 0x11;
          goto LAB_00112aa6;
        }
LAB_001126d0:
        if ((uVar11 & 3) == 0) {
          *(int *)(puVar3 + 0x16) = *(int *)(puVar3 + 0x16) + 1;
          uVar12 = sqlite3VdbeExec((Vdbe *)pStmt);
          *(int *)(puVar3 + 0x16) = *(int *)(puVar3 + 0x16) + -1;
          uVar13 = 100;
          if (uVar12 != 100) goto LAB_001128fb;
          goto LAB_00112a58;
        }
        psVar4 = *(sqlite3 **)pStmt;
        lVar23 = *(long *)(pStmt + 0x10);
        p_01 = (Mem *)(lVar23 + 0x38);
        releaseMemArray(p_01,8);
        *(undefined8 *)(pStmt + 0x28) = 0;
        if (*(int *)(pStmt + 0x84) == 7) {
          psVar4->mallocFailed = '\x01';
LAB_001128f6:
          uVar12 = 1;
          goto LAB_001128fb;
        }
        iVar24 = *(int *)(pStmt + 0x3c);
        uVar11 = *(ushort *)(pStmt + 0x8c) & 3;
        iVar14 = iVar24;
        if (uVar11 == 1) {
          lVar33 = *(long *)(pStmt + 0x10);
          local_1a0 = (Mem *)(lVar33 + 0x1f8);
          if ((*(byte *)(lVar33 + 0x200) & 0x10) == 0) goto LAB_00112828;
          uVar13 = *(int *)(lVar33 + 0x204) >> 3;
          plVar15 = *(long **)(lVar33 + 0x208);
          if (0 < (int)uVar13) {
            uVar19 = 0;
            do {
              iVar14 = iVar14 + *(int *)(plVar15[uVar19] + 8);
              uVar19 = uVar19 + 1;
            } while (uVar13 != uVar19);
          }
        }
        else {
          local_1a0 = (Mem *)0x0;
LAB_00112828:
          plVar15 = (long *)0x0;
          uVar13 = 0;
        }
        iVar32 = *(int *)(pStmt + 0x80);
        lVar33 = (long)iVar32;
        if (iVar14 <= iVar32) {
          iVar14 = iVar32;
        }
        lVar28 = lVar33 * 0x18;
        lVar25 = lVar33 + -1;
        do {
          iVar32 = iVar32 + 1;
          if (lVar25 - iVar14 == -1) {
            *(int *)(pStmt + 0x80) = iVar14 + 1;
            *(undefined4 *)(pStmt + 0x84) = 0;
            uVar12 = 0x65;
            goto LAB_001128fb;
          }
          lVar26 = lVar33;
          if (uVar11 != 2) break;
          lVar26 = lVar25 + 1;
          pcVar17 = (char *)(*(long *)(pStmt + 8) + lVar28);
          lVar28 = lVar28 + 0x18;
          lVar25 = lVar26;
        } while (*pcVar17 != -99);
        iVar14 = (int)lVar26;
        *(int *)(pStmt + 0x80) = iVar32;
        if ((psVar4->u1).isInterrupted != 0) {
          *(undefined4 *)(pStmt + 0x84) = 9;
          sqlite3SetString((char **)pz,psVar4,"%s","interrupted");
          goto LAB_001128f6;
        }
        iVar32 = iVar14 - iVar24;
        if (iVar14 < iVar24) {
          pbVar31 = (byte *)((long)iVar14 * 0x18 + *(long *)(pStmt + 8));
          iVar32 = iVar14;
        }
        else {
          plVar21 = (long *)*plVar15;
          iVar24 = (int)plVar21[1];
          plVar10 = plVar15;
          if (iVar24 <= iVar32) {
            do {
              iVar32 = iVar32 - iVar24;
              plVar21 = (long *)plVar10[1];
              iVar24 = (int)plVar21[1];
              plVar10 = plVar10 + 1;
            } while (iVar24 <= iVar32);
          }
          pbVar31 = (byte *)((long)iVar32 * 0x18 + *plVar21);
        }
        if (uVar11 == 1) {
          *(undefined2 *)(lVar23 + 0x40) = 4;
          *(long *)(lVar23 + 0x38) = (long)iVar32;
          *(undefined2 *)(lVar23 + 0x78) = 0xa02;
          pcVar17 = *(char **)(sqlite3OpcodeName_azName + (ulong)*pbVar31 * 8);
          *(char **)(lVar23 + 0x80) = pcVar17;
          uVar12 = 0xffffffff;
          do {
            uVar12 = uVar12 + 1;
            cVar2 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while (cVar2 != '\0');
          *(uint *)(lVar23 + 0x7c) = uVar12 & 0x3fffffff;
          *(undefined1 *)(lVar23 + 0x7a) = 1;
          p_01 = (Mem *)(lVar23 + 0xa8);
          if (pbVar31[1] == 0xee) {
            if ((int)uVar13 < 1) {
              uVar19 = 0;
LAB_00112cf4:
              if ((uint)uVar19 != uVar13) goto LAB_00112d38;
            }
            else {
              uVar19 = 0;
              do {
                if (plVar15[uVar19] == *(long *)(pbVar31 + 0x10)) goto LAB_00112cf4;
                uVar19 = uVar19 + 1;
              } while (uVar13 != uVar19);
            }
            iVar24 = uVar13 * 8 + 8;
            iVar14 = sqlite3VdbeMemGrow(local_1a0,iVar24,(uint)(uVar13 != 0));
            if (iVar14 == 0) {
              *(undefined8 *)(local_1a0->z + (long)(int)uVar13 * 8) =
                   *(undefined8 *)(pbVar31 + 0x10);
              *(byte *)&local_1a0->flags = (byte)local_1a0->flags | 0x10;
              local_1a0->n = iVar24;
            }
          }
        }
LAB_00112d38:
        p_01->flags = 4;
        p_01->u = (MemValue)(long)*(int *)(pbVar31 + 4);
        p_01[1].flags = 4;
        p_01[1].u = (MemValue)(long)*(int *)(pbVar31 + 8);
        p_01[2].flags = 4;
        p_01[2].u = (MemValue)(long)*(int *)(pbVar31 + 0xc);
        pMem = p_01 + 3;
        if (p_01[3].szMalloc < 0x20) {
          iVar24 = sqlite3VdbeMemGrow(pMem,0x20,0);
          uVar12 = 1;
          if (iVar24 != 0) goto LAB_001128fb;
          pcVar17 = p_01[3].z;
        }
        else {
          pcVar17 = p_01[3].zMalloc;
          p_01[3].z = pcVar17;
        }
        p_01[3].flags = 0x202;
        pcVar27 = pcVar17;
        switch(pbVar31[1]) {
        case 0xed:
switchD_00112dd7_caseD_ed:
          *pcVar17 = '\0';
          pcVar27 = pcVar17;
          break;
        case 0xee:
          pcVar22 = "program";
          goto LAB_00112e92;
        default:
          pcVar27 = *(char **)(pbVar31 + 0x10);
          if (*(char **)(pbVar31 + 0x10) == (char *)0x0) goto switchD_00112dd7_caseD_ed;
          break;
        case 0xf1:
          pcVar22 = "intarray";
LAB_00112e92:
          sqlite3_snprintf(0x20,pcVar17,pcVar22);
          break;
        case 0xf2:
          sqlite3_snprintf(0x20,pcVar17,"%d",(ulong)*(uint *)(pbVar31 + 0x10));
          break;
        case 0xf3:
          puVar16 = *(undefined8 **)(pbVar31 + 0x10);
LAB_00112e16:
          uVar20 = *puVar16;
          pcVar22 = "%lld";
          goto LAB_00112eba;
        case 0xf4:
          puVar16 = *(undefined8 **)(pbVar31 + 0x10);
LAB_00112e36:
          sqlite3_snprintf(0x20,pcVar17,"%.16g",(int)*puVar16);
          break;
        case 0xf6:
          uVar20 = *(undefined8 *)(*(long *)(pbVar31 + 0x10) + 0x10);
          pcVar22 = "vtab:%p";
          goto LAB_00112eba;
        case 0xf8:
          puVar16 = *(undefined8 **)(pbVar31 + 0x10);
          uVar11 = *(ushort *)(puVar16 + 1);
          if ((uVar11 & 2) != 0) {
            pcVar27 = (char *)puVar16[2];
            break;
          }
          if ((uVar11 & 4) != 0) goto LAB_00112e16;
          if ((uVar11 & 8) != 0) goto LAB_00112e36;
          if ((uVar11 & 1) != 0) {
            pcVar22 = "NULL";
            goto LAB_00112e92;
          }
          pcVar27 = "(blob)";
          pcVar22 = "(blob)";
          if (pcVar17 == "(blob)") goto LAB_00112f57;
          goto LAB_00112f3b;
        case 0xfa:
          lVar23 = *(long *)(pbVar31 + 0x10);
          uVar13 = 0;
          sqlite3_snprintf(0x20,pcVar17,"k(%d",(ulong)*(ushort *)(lVar23 + 6));
          if (pcVar17 != (char *)0x0) {
            uVar13 = 0xffffffff;
            pcVar22 = pcVar17;
            do {
              uVar13 = uVar13 + 1;
              cVar2 = *pcVar22;
              pcVar22 = pcVar22 + 1;
            } while (cVar2 != '\0');
            uVar13 = uVar13 & 0x3fffffff;
          }
          local_168 = pMem;
          if (*(short *)(lVar23 + 6) != 0) {
            uVar19 = 0;
            do {
              puVar16 = *(undefined8 **)(lVar23 + 0x20 + uVar19 * 8);
              pcVar22 = "nil";
              if ((puVar16 == (undefined8 *)0x0) ||
                 (pcVar22 = (char *)*puVar16, (int *)pcVar22 != (int *)0x0)) {
                lVar33 = 0;
                do {
                  lVar28 = lVar33;
                  lVar33 = lVar28 + 1;
                } while (*(char *)((long)pcVar22 + lVar28) != '\0');
                uVar12 = (uint)lVar28 & 0x3fffffff;
                if ((uVar12 == 6) &&
                   (bVar6 = (short)*(int *)((long)pcVar22 + 4) != 0x5952,
                   uVar12 = (uint)(bVar6 || *(int *)pcVar22 != 0x414e4942) * 5 + 1,
                   !bVar6 && *(int *)pcVar22 == 0x414e4942)) {
                  pcVar22 = "B";
                }
              }
              else {
                uVar12 = 0;
                pcVar22 = (char *)0x0;
              }
              if (0x1a < (int)(uVar12 + uVar13)) {
                builtin_strncpy(pcVar17 + uVar13,",...",4);
                break;
              }
              pcVar17[uVar13] = ',';
              lVar33 = (ulong)uVar13 + 1;
              if (*(char *)(*(long *)(lVar23 + 0x18) + uVar19) == '\0') {
                uVar13 = (uint)lVar33;
              }
              else {
                uVar13 = uVar13 + 2;
                pcVar17[lVar33] = '-';
              }
              memcpy(pcVar17 + uVar13,pcVar22,(ulong)(uVar12 + 1));
              uVar13 = uVar13 + uVar12;
              uVar19 = uVar19 + 1;
            } while (uVar19 < *(ushort *)(lVar23 + 6));
          }
          (pcVar17 + uVar13)[0] = ')';
          (pcVar17 + uVar13)[1] = '\0';
          pMem = local_168;
          break;
        case 0xfb:
          sqlite3_snprintf(0x20,pcVar17,"%s(%d)",*(undefined8 *)(*(long *)(pbVar31 + 0x10) + 0x30));
          break;
        case 0xfc:
          uVar20 = **(undefined8 **)(pbVar31 + 0x10);
          pcVar22 = "(%.20s)";
LAB_00112eba:
          sqlite3_snprintf(0x20,pcVar17,pcVar22,uVar20);
        }
        pcVar22 = p_01[3].z;
        if (pcVar27 == pcVar22) {
          if (pcVar27 == (char *)0x0) {
            uVar13 = 0;
          }
          else {
LAB_00112f57:
            uVar13 = ~(uint)pcVar27 + (int)pcVar22;
            do {
              uVar13 = uVar13 + 1;
              cVar2 = *pcVar22;
              pcVar22 = pcVar22 + 1;
            } while (cVar2 != '\0');
            uVar13 = uVar13 & 0x3fffffff;
          }
          p_01[3].n = uVar13;
          p_01[3].enc = '\x01';
        }
        else {
LAB_00112f3b:
          sqlite3VdbeMemSetStr(pMem,pcVar27,-1,'\x01',(_func_void_void_ptr *)0x0);
        }
        uVar11 = *(ushort *)(pStmt + 0x8c);
        if ((uVar11 & 3) == 1) {
          if (3 < p_01[4].szMalloc) {
            pcVar17 = p_01[4].zMalloc;
            p_01[4].z = pcVar17;
LAB_00112fd9:
            p_01[4].flags = 0x202;
            p_01[4].n = 2;
            sqlite3_snprintf(3,pcVar17,"%.2x",(ulong)pbVar31[3]);
            p_01[4].enc = '\x01';
            p_01[5].flags = 1;
            uVar11 = *(ushort *)(pStmt + 0x8c);
            goto LAB_0011301c;
          }
          iVar24 = sqlite3VdbeMemGrow(p_01 + 4,4,0);
          uVar12 = 1;
          if (iVar24 == 0) {
            pcVar17 = p_01[4].z;
            goto LAB_00112fd9;
          }
LAB_001128fb:
          if (((puVar3[0x1b] != 0) && (*(char *)((long)puVar3 + 0xa1) == '\0')) &&
             (*(long *)(pStmt + 0xe0) != 0)) {
            sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar3,local_158);
            (*(code *)puVar3[0x1b])
                      (puVar3[0x1c],*(undefined8 *)(pStmt + 0xe0),
                       (local_158[0] - *(long *)(pStmt + 0xb8)) * 1000000);
          }
          uVar13 = uVar12;
          if (uVar12 == 0x65) {
            if (*(int *)(puVar3 + 5) < 1) {
              *(undefined4 *)(pStmt + 0x84) = 0;
            }
            else {
              lVar23 = 0;
              lVar33 = 0;
              iVar24 = 0;
              do {
                p_00 = *(Btree **)(puVar3[4] + 8 + lVar23);
                if (p_00 != (Btree *)0x0) {
                  if ((p_00->sharable != '\0') &&
                     (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')) {
                    btreeLockCarefully(p_00);
                  }
                  pWVar5 = p_00->pBt->pPager->pWal;
                  if (pWVar5 == (Wal *)0x0) {
                    uVar29 = 0;
                  }
                  else {
                    uVar29 = pWVar5->iCallback;
                    pWVar5->iCallback = 0;
                  }
                  if (p_00->sharable != '\0') {
                    piVar1 = &p_00->wantToLock;
                    *piVar1 = *piVar1 + -1;
                    if (*piVar1 == 0) {
                      unlockBtreeMutex(p_00);
                    }
                  }
                  if ((((code *)puVar3[0x23] != (code *)0x0) && (0 < (int)uVar29)) && (iVar24 == 0))
                  {
                    iVar24 = (*(code *)puVar3[0x23])
                                       (puVar3[0x24],puVar3,*(undefined8 *)(puVar3[4] + lVar23),
                                        uVar29);
                  }
                }
                lVar33 = lVar33 + 1;
                lVar23 = lVar23 + 0x20;
              } while (lVar33 < *(int *)(puVar3 + 5));
              *(int *)(pStmt + 0x84) = iVar24;
              uVar13 = 1;
              if (iVar24 != 0) goto LAB_00112a58;
            }
            uVar13 = 0x65;
          }
        }
        else {
LAB_0011301c:
          *(ushort *)(pStmt + 0x88) = (~uVar11 & 3) << 2;
          *(long *)(pStmt + 0x28) = *(long *)(pStmt + 0x10) + 0x38;
          *(undefined4 *)(pStmt + 0x84) = 0;
          uVar13 = 100;
        }
LAB_00112a58:
        *(uint *)((long)puVar3 + 0x44) = uVar13;
        psVar4 = *(sqlite3 **)pStmt;
        uVar12 = *(uint *)(pStmt + 0x84);
        if (psVar4 == (sqlite3 *)0x0) {
          uVar12 = uVar12 & 0xff;
LAB_00112a90:
          uVar18 = 7;
          if (uVar12 == 7) goto LAB_00112aa6;
        }
        else {
          if ((uVar12 != 0xc0a) && (psVar4->mallocFailed == '\0')) {
            uVar12 = uVar12 & psVar4->errMask;
            goto LAB_00112a90;
          }
          apiOomError(psVar4);
          uVar18 = 7;
LAB_00112aa6:
          *(undefined4 *)(pStmt + 0x84) = uVar18;
        }
        if ((uVar13 - 0x66 < 0xfffffffe) && ((*(ushort *)(pStmt + 0x8c) & 0x100) != 0)) {
          uVar13 = sqlite3VdbeTransferError((Vdbe *)pStmt);
        }
        uVar13 = uVar13 & *(uint *)(puVar3 + 9);
        if (uVar13 != 0x11) goto LAB_0011328a;
        if (iVar30 == 0x32) {
          uVar13 = 0x11;
          goto LAB_0011328a;
        }
        if (((byte)pStmt[0x8d] & 1) == 0) {
          pcVar17 = (char *)0x0;
        }
        else {
          pcVar17 = *(char **)(pStmt + 0xe0);
        }
        iVar24 = *(int *)(pStmt + 0x80);
        psVar4 = *(sqlite3 **)pStmt;
        uVar13 = sqlite3LockAndPrepare
                           (psVar4,pcVar17,-1,0,(Vdbe *)pStmt,(sqlite3_stmt **)&local_170,
                            (char **)0x0);
        pFromStmt = local_170;
        if (uVar13 != 0) {
          if (uVar13 == 7) {
            psVar4->mallocFailed = '\x01';
          }
          pcVar17 = (char *)sqlite3ValueText(db->pErr,'\x01');
          sqlite3DbFree(db,*(char **)pz);
          if (db->mallocFailed == '\0') {
            pcVar17 = sqlite3DbStrDup(db,pcVar17);
          }
          else {
            uVar13 = 7;
            pcVar17 = (char *)0x0;
          }
          *(char **)pz = pcVar17;
LAB_00113283:
          *(uint *)(pStmt + 0x84) = uVar13;
LAB_0011328a:
          if ((uVar13 == 0xc0a) || (db->mallocFailed != '\0')) {
            apiOomError(db);
            uVar13 = 7;
          }
          else {
            uVar13 = uVar13 & db->errMask;
          }
          if (db->mutex == (sqlite3_mutex *)0x0) {
            return uVar13;
          }
          (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
          return uVar13;
        }
        iVar30 = iVar30 + 1;
        memcpy(local_158,local_170,0x128);
        memcpy(pFromStmt,pStmt,0x128);
        memcpy(pStmt,local_158,0x128);
        pVVar7 = *(Vdbe **)(pStmt + 0x58);
        pVVar8 = pFromStmt->pPrev;
        pVVar9 = pFromStmt->pNext;
        pFromStmt->pPrev = *(Vdbe **)(pStmt + 0x50);
        pFromStmt->pNext = pVVar7;
        *(Vdbe **)(pStmt + 0x50) = pVVar8;
        *(Vdbe **)(pStmt + 0x58) = pVVar9;
        pcVar17 = pFromStmt->zSql;
        pFromStmt->zSql = *(char **)(pStmt + 0xe0);
        *(char **)(pStmt + 0xe0) = pcVar17;
        *(ushort *)(pStmt + 0x8c) =
             (ushort)*(undefined4 *)(pStmt + 0x8c) & 0xfeff |
             *(ushort *)&pFromStmt->field_0x8c & 0x100;
        sqlite3TransferBindings((sqlite3_stmt *)pFromStmt,pStmt);
        local_170->rc = 0;
        sqlite3VdbeFinalize(local_170);
        sqlite3_reset(pStmt);
        if (-1 < iVar24) {
          pStmt[0x8d] = (sqlite3_stmt)((byte)pStmt[0x8d] | 2);
        }
      } while( true );
    }
    pcVar17 = "API called with finalized prepared statement";
  }
  sqlite3_log(0x15,pcVar17);
  sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x10f20,"8a8ffc862e96f57aa698f93de10dee28e69f6e09"
             );
  return 0x15;
}

Assistant:

SQLITE_STDCALL sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  int rc2 = SQLITE_OK;     /* Result from sqlite3Reprepare() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc2 = rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK) break;
    sqlite3_reset(pStmt);
    if( savedPc>=0 ) v->doingRerun = 1;
    assert( v->expired==0 );
  }
  if( rc2!=SQLITE_OK ){
    /* This case occurs after failing to recompile an sql statement. 
    ** The error message from the SQL compiler has already been loaded 
    ** into the database handle. This block copies the error message 
    ** from the database handle into the statement and sets the statement
    ** program counter to 0 to ensure that when the statement is 
    ** finalized or reset the parser error message is available via
    ** sqlite3_errmsg() and sqlite3_errcode().
    */
    const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
    sqlite3DbFree(db, v->zErrMsg);
    if( !db->mallocFailed ){
      v->zErrMsg = sqlite3DbStrDup(db, zErr);
      v->rc = rc2;
    } else {
      v->zErrMsg = 0;
      v->rc = rc = SQLITE_NOMEM;
    }
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}